

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O2

_Bool borg_flow_recover(_Bool viewable,wchar_t dist)

{
  loc_conflict grid1;
  chunk_conflict *c;
  _Bool _Var1;
  wchar_t wVar2;
  loc grid;
  loc_conflict grid2;
  long lVar3;
  wchar_t y;
  long lVar4;
  wchar_t x;
  long lVar5;
  
  if (500 < borg.time_this_panel) {
    return false;
  }
  if (borg.trait[0x23] < 6) {
    return false;
  }
  _Var1 = borg_primarily_caster();
  if (_Var1) {
    if ((borg.trait[0x1b] <= borg.trait[0x1c] / 3) ||
       ((borg.trait[0x1f] != 0 && (borg.trait[0x1e] <= borg.trait[0x1f] / 4)))) goto LAB_0020b085;
  }
  else if (borg.trait[0x1b] <= borg.trait[0x1c] / 3) goto LAB_0020b085;
  if ((borg.trait[0x74] == 0) &&
     (((borg.trait[0x75] == 0 && (borg.trait[0x76] == 0)) && (borg.trait[0x71] == 0)))) {
    return false;
  }
LAB_0020b085:
  if (((borg.goal.fleeing == false) && (borg.lunal_mode == false)) &&
     ((borg.munchkin_mode == false && (borg.trait[0x6d] == 0)))) {
    borg_temp_n = 0;
    for (lVar4 = (long)(borg.c.y + -0x19); lVar4 < borg.c.y + 0x19; lVar4 = lVar4 + 1) {
      lVar5 = (long)(borg.c.x + -0x19);
      lVar3 = lVar5 * 0xc;
      for (; c = cave, lVar5 < borg.c.x + 0x19; lVar5 = lVar5 + 1) {
        x = (wchar_t)lVar5;
        y = (wchar_t)lVar4;
        grid = (loc)loc(x,y);
        _Var1 = square_in_bounds(c,grid);
        if ((_Var1) && ((borg.c.y != y || (x != borg.c.x)))) {
          grid2 = loc(x,y);
          grid1.y = borg.c.y;
          grid1.x = borg.c.x;
          wVar2 = distance(grid1,grid2);
          if ((L'\x06' < wVar2) &&
             (((_Var1 = borg_happy_grid_bold(y,x), _Var1 &&
               ((&borg_grids[lVar4]->feat)[lVar3] < 0xf || (&borg_grids[lVar4]->feat)[lVar3] == 0x18
               )) && (_Var1 = borg_check_rest(y,x), _Var1)))) {
            borg_temp_x[borg_temp_n] = (uint8_t)lVar5;
            borg_temp_y[borg_temp_n] = (uint8_t)lVar4;
            borg_temp_n = borg_temp_n + 1;
          }
        }
        lVar3 = lVar3 + 0xc;
      }
    }
    if (borg_temp_n != 0) {
      borg_flow_clear();
      for (lVar4 = 0; lVar4 < borg_temp_n; lVar4 = lVar4 + 1) {
        borg_flow_enqueue_grid((uint)borg_temp_y[lVar4],(uint)borg_temp_x[lVar4]);
      }
      borg_flow_spread(dist,false,true,false,L'\xffffffff',false);
      _Var1 = borg_flow_commit("Recover Grid",L'\t');
      if (_Var1) {
        _Var1 = borg_flow_old(L'\t');
        return _Var1;
      }
    }
  }
  return false;
}

Assistant:

bool borg_flow_recover(bool viewable, int dist)
{
    int i, x, y;

    /* Sometimes we loop on this */
    if (borg.time_this_panel > 500)
        return false;

    /* No retreating and recovering when low level */
    if (borg.trait[BI_CLEVEL] <= 5)
        return false;

    /* Mana for spell casters */
    if (borg_primarily_caster()) {
        if (borg.trait[BI_CURHP] > borg.trait[BI_MAXHP] / 3
            && ((borg.trait[BI_CURSP] > borg.trait[BI_MAXSP] / 4)
                || borg.trait[BI_MAXSP] == 0)
            && /* Non spell casters? */
            !borg.trait[BI_ISCUT] && !borg.trait[BI_ISSTUN]
            && !borg.trait[BI_ISHEAVYSTUN] && !borg.trait[BI_ISAFRAID])
            return false;
    } else /* Non Spell Casters */
    {
        /* do I need to recover some? */
        if (borg.trait[BI_CURHP] > borg.trait[BI_MAXHP] / 3
            && !borg.trait[BI_ISCUT] && !borg.trait[BI_ISSTUN]
            && !borg.trait[BI_ISHEAVYSTUN] && !borg.trait[BI_ISAFRAID])
            return false;
    }

    /* If Fleeing, then do not rest */
    if (borg.goal.fleeing)
        return false;

    /* If Scumming, then do not rest */
    if (borg.lunal_mode || borg.munchkin_mode)
        return false;

    /* No need if hungry */
    if (borg.trait[BI_ISHUNGRY])
        return false;

    /* Nothing found */
    borg_temp_n = 0;

    /* Scan some known Grids
     * Favor the following types of grids:
     * 1. Happy grids
     */

    /* look at grids within 20 grids of me */
    for (y = borg.c.y - 25; y < borg.c.y + 25; y++) {

        for (x = borg.c.x - 25; x < borg.c.x + 25; x++) {
            /* Stay in bounds */
            if (!square_in_bounds(cave, loc(x, y)))
                continue;

            /* Skip my own grid */
            if (y == borg.c.y && x == borg.c.x)
                continue;

            /* Skip grids that are too close to me */
            if (distance(borg.c, loc(x, y)) < 7)
                continue;

            /* Is this grid a happy grid? */
            if (!borg_happy_grid_bold(y, x))
                continue;

            /* Can't rest on a wall grid. */
            /* HACK depends on FEAT order, kinda evil */
            if (borg_grids[y][x].feat >= FEAT_SECRET
                && borg_grids[y][x].feat != FEAT_PASS_RUBBLE)
                continue;

            /* Can I rest on that one? */
            if (!borg_check_rest(y, x))
                continue;

            /* Careful -- Remember it */
            borg_temp_x[borg_temp_n] = x;
            borg_temp_y[borg_temp_n] = y;
            borg_temp_n++;
        }
    }

    /* Nothing to kill */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look through the good grids */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    borg_flow_spread(dist, false, true, false, -1, false);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("Recover Grid", GOAL_RECOVER))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_RECOVER))
        return false;

    return true;
}